

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_read_rsa_exponent(uint8_t *domain_parameters,size_t domain_parameters_size,int *exponent)

{
  uint local_34;
  ulong uStack_30;
  uint32_t acc;
  size_t i;
  int *exponent_local;
  size_t domain_parameters_size_local;
  uint8_t *domain_parameters_local;
  
  local_34 = 0;
  if (domain_parameters_size == 0) {
    *exponent = 0x10001;
    domain_parameters_local._4_4_ = 0;
  }
  else if (domain_parameters_size < 5) {
    for (uStack_30 = 0; uStack_30 < domain_parameters_size; uStack_30 = uStack_30 + 1) {
      local_34 = local_34 << 8 | (uint)domain_parameters[uStack_30];
    }
    if (local_34 < 0x80000000) {
      *exponent = local_34;
      domain_parameters_local._4_4_ = 0;
    }
    else {
      domain_parameters_local._4_4_ = -0x86;
    }
  }
  else {
    domain_parameters_local._4_4_ = -0x86;
  }
  return domain_parameters_local._4_4_;
}

Assistant:

static psa_status_t psa_read_rsa_exponent( const uint8_t *domain_parameters,
                                           size_t domain_parameters_size,
                                           int *exponent )
{
    size_t i;
    uint32_t acc = 0;

    if( domain_parameters_size == 0 )
    {
        *exponent = 65537;
        return( PSA_SUCCESS );
    }

    /* Mbed TLS encodes the public exponent as an int. For simplicity, only
     * support values that fit in a 32-bit integer, which is larger than
     * int on just about every platform anyway. */
    if( domain_parameters_size > sizeof( acc ) )
        return( PSA_ERROR_NOT_SUPPORTED );
    for( i = 0; i < domain_parameters_size; i++ )
        acc = ( acc << 8 ) | domain_parameters[i];
    if( acc > INT_MAX )
        return( PSA_ERROR_NOT_SUPPORTED );
    *exponent = acc;
    return( PSA_SUCCESS );
}